

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O1

S2Point * __thiscall
S2Polyline::Project(S2Point *__return_storage_ptr__,S2Polyline *this,S2Point *point,int *next_vertex
                   )

{
  double *pdVar1;
  double dVar2;
  VType VVar3;
  uint uVar4;
  S2Point *pSVar5;
  S2Point *pSVar6;
  long lVar7;
  double *ap;
  int k;
  int k_00;
  bool bVar8;
  S1Angle SVar9;
  S1Angle SVar10;
  S2LogMessage local_40;
  
  if (this->num_vertices_ < 1) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
               ,0xdf,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: (num_vertices()) > (0) ",0x25);
LAB_0021301a:
    abort();
  }
  if (this->num_vertices_ == 1) {
    *next_vertex = 1;
    pSVar5 = vertex(this,0);
    VVar3 = pSVar5->c_[1];
    __return_storage_ptr__->c_[0] = pSVar5->c_[0];
    __return_storage_ptr__->c_[1] = VVar3;
    __return_storage_ptr__->c_[2] = pSVar5->c_[2];
  }
  else {
    k_00 = -1;
    if (1 < this->num_vertices_) {
      SVar9.radians_ = 10.0;
      k_00 = -1;
      k = 1;
      do {
        pSVar5 = vertex(this,k + -1);
        pSVar6 = vertex(this,k);
        SVar10 = S2::GetDistance(point,pSVar5,pSVar6);
        if (SVar10.radians_ < SVar9.radians_) {
          SVar9 = SVar10;
          k_00 = k;
        }
        k = k + 1;
      } while (k < this->num_vertices_);
    }
    if (k_00 == -1) {
      S2LogMessage::S2LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
                 ,0xf4,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_40.stream_,"Check failed: (min_index) != (-1) ",0x22);
      goto LAB_0021301a;
    }
    pSVar5 = vertex(this,k_00 + -1);
    pSVar6 = vertex(this,k_00);
    S2::Project(__return_storage_ptr__,point,pSVar5,pSVar6);
    pSVar5 = vertex(this,k_00);
    if ((__return_storage_ptr__->c_[0] != pSVar5->c_[0]) ||
       (NAN(__return_storage_ptr__->c_[0]) || NAN(pSVar5->c_[0]))) {
      uVar4 = 0;
    }
    else {
      lVar7 = 0;
      do {
        bVar8 = lVar7 == 0x10;
        if (bVar8) goto LAB_00212f80;
        dVar2 = *(double *)((long)__return_storage_ptr__->c_ + lVar7 + 8);
        pdVar1 = (double *)((long)pSVar5->c_ + lVar7 + 8);
        lVar7 = lVar7 + 8;
      } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
      bVar8 = false;
LAB_00212f80:
      uVar4 = (uint)bVar8;
    }
    *next_vertex = k_00 + uVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Polyline::Project(const S2Point& point, int* next_vertex) const {
  S2_DCHECK_GT(num_vertices(), 0);

  if (num_vertices() == 1) {
    // If there is only one vertex, it is always closest to any given point.
    *next_vertex = 1;
    return vertex(0);
  }

  // Initial value larger than any possible distance on the unit sphere.
  S1Angle min_distance = S1Angle::Radians(10);
  int min_index = -1;

  // Find the line segment in the polyline that is closest to the point given.
  for (int i = 1; i < num_vertices(); ++i) {
    S1Angle distance_to_segment = S2::GetDistance(point, vertex(i-1),
                                                          vertex(i));
    if (distance_to_segment < min_distance) {
      min_distance = distance_to_segment;
      min_index = i;
    }
  }
  S2_DCHECK_NE(min_index, -1);

  // Compute the point on the segment found that is closest to the point given.
  S2Point closest_point =
      S2::Project(point, vertex(min_index - 1), vertex(min_index));

  *next_vertex = min_index + (closest_point == vertex(min_index) ? 1 : 0);
  return closest_point;
}